

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O1

void read_header(FILE *inputFilePtr)

{
  byte_t header;
  byte local_9;
  
  fread(&local_9,1,1,(FILE *)inputFilePtr);
  bits_to_ignore = (uint)(local_9 >> 5);
  in_bit_idx = 3;
  output_byte_idx = 0;
  return;
}

Assistant:

void read_header(FILE *inputFilePtr) {
    byte_t header;
    fread(&header, sizeof(byte_t), 1, inputFilePtr);

    first_byte_union first_byte;
    first_byte.raw = header;

    bits_to_ignore = first_byte.split.header;
    in_bit_idx = HEADER_BITS;
    output_byte_idx = 0;

#ifdef _DEBUG
    log_debug("read_header", "bits_to_ignore=%d\n", bits_to_ignore);
#endif
}